

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp.c
# Opt level: O2

ex_ex * eval_tab(expr *expr,ex_ex *eptr,ex_ex *optr,int idx)

{
  bool bVar1;
  ex_ex *peVar2;
  fts_symbol_t s;
  anon_union_8_5_735de1bb_for_ex_cont local_48;
  long lStack_40;
  undefined8 local_38;
  
  local_38 = 0;
  if (eptr->ex_type == 5) {
    s = (fts_symbol_t)(eptr->ex_cont).v_vec;
    bVar1 = true;
    if (s != (fts_symbol_t)0x0) goto LAB_0018f18d;
    post("expr: abstraction argument for table not set");
  }
  else if (eptr->ex_type == 0xd) {
    s = (fts_symbol_t)expr->exp_var[(eptr->ex_cont).v_int].ex_cont.v_vec;
    bVar1 = true;
    if (s != (fts_symbol_t)0x0) goto LAB_0018f18d;
    if ((expr->exp_error & 8) == 0) {
      post("expr: syntax error: no string for inlet %d",(eptr->ex_cont).v_int + 1);
      post("expr: No more table errors will be reported");
      post("expr: till the next reset");
      *(byte *)&expr->exp_error = (byte)expr->exp_error | 8;
    }
  }
  else {
    pd_error(expr,"expr: eval_tbl: bad type %ld\n");
  }
  s = (fts_symbol_t)0x0;
  bVar1 = false;
LAB_0018f18d:
  local_48.v_int = 0;
  lStack_40 = 0;
  peVar2 = ex_eval(expr,eptr + 1,(ex_ex *)&local_48,idx);
  if (peVar2 != (ex_ex *)0x0) {
    optr->ex_type = 1;
    (optr->ex_cont).v_int = 0;
    if (bVar1) {
      max_ex_tab(expr,s,(ex_ex *)&local_48,optr);
    }
    if (lStack_40 == 0xf) {
      free(local_48.v_vec);
    }
  }
  return peVar2;
}

Assistant:

struct ex_ex *
eval_tab(struct expr *expr, struct ex_ex *eptr, struct ex_ex *optr, int idx)
/* the expr object data pointer */
/* the operation stack */
/* the result pointer */
{
        struct ex_ex arg = { 0 };
        char *tbl = (char *) 0;
        int notable = 0;

        if (eptr->ex_type == ET_SI) {
                if (!expr->exp_var[eptr->ex_int].ex_ptr) {
                        if (!(expr->exp_error & EE_NOTABLE)) {
                                post("expr: syntax error: no string for inlet %d",
                                                                                                                        eptr->ex_int + 1);
                                post("expr: No more table errors will be reported");
                                post("expr: till the next reset");
                                expr->exp_error |= EE_NOTABLE;
                        }
                        notable++;
                } else
                        tbl = (char *) expr->exp_var[eptr->ex_int].ex_ptr;
        } else if (eptr->ex_type == ET_TBL) {
                tbl = (char *) eptr->ex_ptr;
                if (!tbl) {
                        post("expr: abstraction argument for table not set");
                        notable++;
                }

        } else {
                post_error((fts_object_t *) expr,"expr: eval_tbl: bad type %ld\n",eptr->ex_type);
                notable++;

        }
        arg.ex_type = 0;
        arg.ex_int = 0;
        if (!(eptr = ex_eval(expr, ++eptr, &arg, idx)))
                return (eptr);

        optr->ex_type = ET_INT;
        optr->ex_int = 0;
        if (!notable)
                (void)max_ex_tab(expr, (t_symbol *)tbl, &arg, optr);
        if (arg.ex_type == ET_VEC)
                fts_free(arg.ex_vec);
        return (eptr);
}